

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::ConvolutionParameter::Clear(ConvolutionParameter *this)

{
  bool bVar1;
  LogMessage *pLVar2;
  LogFinisher local_ea;
  byte local_e9;
  LogMessage local_e8;
  LogFinisher local_ad [20];
  byte local_99;
  LogMessage local_98;
  ConvolutionParameter *local_60;
  ConvolutionParameter *this_local;
  InternalMetadataWithArena *local_50;
  InternalMetadataWithArena *local_48;
  undefined4 local_3c;
  HasBits<1UL> *local_38;
  undefined4 local_2c;
  HasBits<1UL> *local_28;
  undefined4 local_1c;
  HasBits<1UL> *local_18;
  InternalMetadataWithArena *local_10;
  
  local_60 = this;
  google::protobuf::RepeatedField<unsigned_int>::Clear(&this->pad_);
  google::protobuf::RepeatedField<unsigned_int>::Clear(&this->kernel_size_);
  google::protobuf::RepeatedField<unsigned_int>::Clear(&this->stride_);
  google::protobuf::RepeatedField<unsigned_int>::Clear(&this->dilation_);
  local_18 = &this->_has_bits_;
  local_1c = 0;
  if ((local_18->has_bits_[0] & 3) != 0) {
    bVar1 = has_weight_filler(this);
    if (bVar1) {
      local_99 = 0;
      if (this->weight_filler_ == (FillerParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_98,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x53ba);
        local_99 = 1;
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_98,"CHECK failed: weight_filler_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(local_ad,pLVar2);
      }
      if ((local_99 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_98);
      }
      FillerParameter::Clear(this->weight_filler_);
    }
    bVar1 = has_bias_filler(this);
    if (bVar1) {
      local_e9 = 0;
      if (this->bias_filler_ == (FillerParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_e8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x53be);
        local_e9 = 1;
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_e8,"CHECK failed: bias_filler_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_ea,pLVar2);
      }
      if ((local_e9 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_e8);
      }
      FillerParameter::Clear(this->bias_filler_);
    }
  }
  local_28 = &this->_has_bits_;
  local_2c = 0;
  if ((local_28->has_bits_[0] & 0xfc) != 0) {
    memset(&this->num_output_,0,0x18);
  }
  local_38 = &this->_has_bits_;
  local_3c = 0;
  if ((local_38->has_bits_[0] & 0x3f00) != 0) {
    memset(&this->stride_w_,0,9);
    this->axis_ = 1;
    this->bias_term_ = true;
    this->group_ = 1;
  }
  this_local = (ConvolutionParameter *)&this->_has_bits_;
  memset(this_local,0,4);
  local_50 = &this->_internal_metadata_;
  if (((uint)(local_50->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_48 = local_50;
    local_10 = local_50;
    google::protobuf::internal::InternalMetadataWithArena::DoClear(local_50);
  }
  return;
}

Assistant:

void ConvolutionParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.ConvolutionParameter)
  pad_.Clear();
  kernel_size_.Clear();
  stride_.Clear();
  dilation_.Clear();
  if (_has_bits_[0 / 32] & 3u) {
    if (has_weight_filler()) {
      GOOGLE_DCHECK(weight_filler_ != NULL);
      weight_filler_->::caffe::FillerParameter::Clear();
    }
    if (has_bias_filler()) {
      GOOGLE_DCHECK(bias_filler_ != NULL);
      bias_filler_->::caffe::FillerParameter::Clear();
    }
  }
  if (_has_bits_[0 / 32] & 252u) {
    ::memset(&num_output_, 0, reinterpret_cast<char*>(&stride_h_) -
      reinterpret_cast<char*>(&num_output_) + sizeof(stride_h_));
  }
  if (_has_bits_[8 / 32] & 16128u) {
    ::memset(&stride_w_, 0, reinterpret_cast<char*>(&force_nd_im2col_) -
      reinterpret_cast<char*>(&stride_w_) + sizeof(force_nd_im2col_));
    axis_ = 1;
    bias_term_ = true;
    group_ = 1u;
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}